

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wthelper.h
# Opt level: O0

ktx_uint32_t
WriterTestHelper<unsigned_char,_1U,_33321U>::levelsFromSize
          (ktx_uint32_t width,ktx_uint32_t height,ktx_uint32_t depth)

{
  ktx_uint32_t local_20;
  ktx_uint32_t local_1c;
  uint local_18;
  ktx_uint32_t max_dim;
  ktx_uint32_t mipLevels;
  ktx_uint32_t depth_local;
  ktx_uint32_t height_local;
  ktx_uint32_t width_local;
  
  local_18 = height;
  if (height < width) {
    local_18 = width;
  }
  local_20 = depth;
  if (depth < local_18) {
    local_1c = height;
    if (height < width) {
      local_1c = width;
    }
    local_20 = local_1c;
  }
  mipLevels = 1;
  for (max_dim = local_20; max_dim != 1; max_dim = max_dim >> 1) {
    mipLevels = mipLevels + 1;
  }
  return mipLevels;
}

Assistant:

static ktx_uint32_t
    levelsFromSize(ktx_uint32_t width, ktx_uint32_t height, ktx_uint32_t depth) {
        ktx_uint32_t mipLevels;
        ktx_uint32_t max_dim = MAX(MAX(width, height), depth);
        for (mipLevels = 1; max_dim != 1; mipLevels++, max_dim >>= 1) { }
        return mipLevels;
    }